

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

bool __thiscall
soul::SourceCodeModel::rebuild
          (SourceCodeModel *this,CompileMessageList *errors,
          ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_> filesToLoad)

{
  string_view firstReplacement;
  bool bVar1;
  Namespace *parentNamespace;
  size_t __new_size;
  RefCountedPtr<soul::SourceCodeText> *pRVar2;
  ModuleBase *m_00;
  SourceCodeText *pSVar3;
  ulong uVar4;
  char *pcVar5;
  Comment *summary;
  Comment *summary_00;
  undefined1 auVar6 [16];
  string_view name;
  string_view firstToReplace;
  string *in_stack_fffffffffffffd08;
  string *in_stack_fffffffffffffd10;
  string local_288;
  string local_268;
  RefCountedPtr<soul::SourceCodeText> local_248;
  CodeLocation local_240;
  Comment local_230;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  string local_1d0 [32];
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [16];
  string local_160;
  undefined4 local_140;
  pool_ref *ppStack_138;
  AbortCompilationException anon_var_0;
  pool_ref<soul::AST::ModuleBase> *m;
  iterator __end3;
  iterator __begin3;
  CodeLocation local_118;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  local_108;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  *local_f0;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  *__range3;
  CompileMessageHandler handler;
  value_type *desc;
  RefCountedPtr<soul::SourceCodeText> *f;
  size_t i;
  Namespace *topLevelNamespace;
  Allocator allocator;
  CompileMessageList *errors_local;
  SourceCodeModel *this_local;
  ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_> filesToLoad_local;
  
  filesToLoad_local.s = filesToLoad.e;
  this_local = (SourceCodeModel *)filesToLoad.s;
  allocator.stringDictionary._32_8_ = errors;
  std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>::clear
            (&this->files);
  AST::Allocator::Allocator((Allocator *)&topLevelNamespace);
  parentNamespace = AST::createRootNamespace((Allocator *)&topLevelNamespace);
  __new_size = ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_>::size
                         ((ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_> *)&this_local);
  std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>::resize
            (&this->files,__new_size);
  f = (RefCountedPtr<soul::SourceCodeText> *)0x0;
  do {
    pRVar2 = (RefCountedPtr<soul::SourceCodeText> *)
             ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_>::size
                       ((ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_> *)&this_local);
    if (pRVar2 <= f) {
      filesToLoad_local.e._7_1_ = 1;
LAB_003277a1:
      local_140 = 1;
      AST::Allocator::~Allocator((Allocator *)&topLevelNamespace);
      return (bool)(filesToLoad_local.e._7_1_ & 1);
    }
    pRVar2 = ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_>::operator[]
                       ((ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_> *)&this_local,
                        (size_t)f);
    handler.lastHandler =
         (CompileMessageHandler *)
         std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>::
         operator[](&this->files,(size_type)f);
    CompileMessageHandler::CompileMessageHandler
              ((CompileMessageHandler *)&__range3,
               (CompileMessageList *)allocator.stringDictionary._32_8_);
    RefCountedPtr<soul::SourceCodeText>::RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&__begin3,pRVar2);
    CodeLocation::CodeLocation(&local_118,(Ptr *)&__begin3);
    Compiler::parseTopLevelDeclarations
              (&local_108,(Allocator *)&topLevelNamespace,&local_118,parentNamespace);
    CodeLocation::~CodeLocation(&local_118);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&__begin3);
    local_f0 = &local_108;
    __end3 = std::
             vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
             ::begin(local_f0);
    m = (pool_ref<soul::AST::ModuleBase> *)
        std::
        vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
        ::end(local_f0);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
                                  *)&m);
      if (!bVar1) break;
      ppStack_138 = (pool_ref *)
                    __gnu_cxx::
                    __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
                    ::operator*(&__end3);
      ASTUtilities::mergeDuplicateNamespaces(parentNamespace);
      m_00 = pool_ref::operator_cast_to_ModuleBase_(ppStack_138);
      recurseFindingModules
                (m_00,(File *)handler.lastHandler,
                 (StringDictionary *)
                 &allocator.identifiers.strings.
                  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
    ::~vector(&local_108);
    CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)&__range3);
    bVar1 = CompileMessageList::hasErrors((CompileMessageList *)allocator.stringDictionary._32_8_);
    if (bVar1) {
      filesToLoad_local.e._7_1_ = 0;
      goto LAB_003277a1;
    }
    RefCountedPtr<soul::SourceCodeText>::operator=
              ((RefCountedPtr<soul::SourceCodeText> *)handler.lastHandler,pRVar2);
    pSVar3 = RefCountedPtr<soul::SourceCodeText>::operator->(pRVar2);
    std::__cxx11::string::operator=
              ((string *)&handler.lastHandler[2].handleMessageFn._M_invoker,
               (string *)&pSVar3->filename);
    std::__cxx11::string::string
              (local_1d0,(string *)&handler.lastHandler[2].handleMessageFn._M_invoker);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0,".soul");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f0,"");
    firstReplacement._M_str = (char *)in_stack_fffffffffffffd10;
    firstReplacement._M_len = (size_t)in_stack_fffffffffffffd08;
    firstToReplace._M_str = (char *)local_1f0._M_len;
    firstToReplace._M_len = (size_t)local_1e0._M_str;
    pcVar5 = local_1e0._M_str;
    choc::text::replace<std::__cxx11::string>
              (&local_1b0,(text *)local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._M_len
               ,firstToReplace,firstReplacement);
    std::operator+(&local_190,"lib_",&local_1b0);
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_190);
    name._M_len = auVar6._8_8_;
    name._M_str = pcVar5;
    local_170 = auVar6;
    makeUID_abi_cxx11_(&local_160,auVar6._0_8_,name);
    in_stack_fffffffffffffd10 = &local_160;
    std::__cxx11::string::operator=
              ((string *)&handler.lastHandler[1].lastHandler,(string *)in_stack_fffffffffffffd10);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffffd10);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string(local_1d0);
    RefCountedPtr<soul::SourceCodeText>::RefCountedPtr(&local_248,pRVar2);
    CodeLocation::CodeLocation(&local_240,&local_248);
    SourceCodeUtilities::getFileSummaryComment(&local_230,&local_240);
    SourceCodeUtilities::Comment::operator=
              ((Comment *)
               ((long)&((handler.lastHandler)->handleMessageFn).super__Function_base._M_functor + 8)
               ,&local_230);
    SourceCodeUtilities::Comment::~Comment(&local_230);
    CodeLocation::~CodeLocation(&local_240);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_248);
    SourceCodeUtilities::getFileSummaryTitle_abi_cxx11_
              (&local_268,
               (SourceCodeUtilities *)
               (((handler.lastHandler)->handleMessageFn).super__Function_base._M_functor._M_pod_data
               + 8),summary);
    in_stack_fffffffffffffd08 = &local_268;
    std::__cxx11::string::operator=
              ((string *)&handler.lastHandler[3].handleMessageFn.super__Function_base._M_manager,
               (string *)in_stack_fffffffffffffd08);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffffd08);
    SourceCodeUtilities::getFileSummaryBody_abi_cxx11_
              (&local_288,
               (SourceCodeUtilities *)
               (((handler.lastHandler)->handleMessageFn).super__Function_base._M_functor._M_pod_data
               + 8),summary_00);
    std::__cxx11::string::operator=
              ((string *)
               (handler.lastHandler[4].handleMessageFn.super__Function_base._M_functor._M_pod_data +
               8),(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      std::__cxx11::string::operator=
                ((string *)&handler.lastHandler[3].handleMessageFn.super__Function_base._M_manager,
                 (string *)&handler.lastHandler[2].handleMessageFn._M_invoker);
    }
    f = (RefCountedPtr<soul::SourceCodeText> *)((long)&f->object + 1);
  } while( true );
}

Assistant:

bool SourceCodeModel::rebuild (CompileMessageList& errors, ArrayView<SourceCodeText::Ptr> filesToLoad)
{
    files.clear();
    AST::Allocator allocator;
    auto& topLevelNamespace = AST::createRootNamespace (allocator);

    files.resize (filesToLoad.size());

    for (size_t i = 0; i < filesToLoad.size(); ++i)
    {
        auto& f = filesToLoad[i];
        auto& desc = files[i];

        try
        {
            CompileMessageHandler handler (errors);

            for (auto& m : Compiler::parseTopLevelDeclarations (allocator, f, topLevelNamespace))
            {
                ASTUtilities::mergeDuplicateNamespaces (topLevelNamespace);
                recurseFindingModules (m, desc, allocator.stringDictionary);
            }
        }
        catch (AbortCompilationException) {}

        if (errors.hasErrors())
            return false;

        desc.source = f;
        desc.filename = f->filename;
        desc.UID = makeUID ("lib_" + choc::text::replace (desc.filename, ".soul", ""));
        desc.fileComment = SourceCodeUtilities::getFileSummaryComment (f);
        desc.title = SourceCodeUtilities::getFileSummaryTitle (desc.fileComment);
        desc.summary = SourceCodeUtilities::getFileSummaryBody (desc.fileComment);

        if (desc.title.empty())
            desc.title = desc.filename;
    }

    return true;
}